

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

vm_obj_id_t __thiscall CTPNSelf::gen_code_obj_predot(CTPNSelf *this,int *is_self)

{
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  *is_self = 1;
  return 0;
}

Assistant:

vm_obj_id_t CTPNSelf::gen_code_obj_predot(int *is_self)
{
    /* make sure "self" is available */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* tell the caller that this is "self" */
    *is_self = TRUE;
    return VM_INVALID_OBJ;
}